

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_chacha20_poly1305.c
# Opt level: O0

int chacha20_poly1305_cipher(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t len)

{
  POLY1305 *pPVar1;
  int iVar2;
  POLY1305 *in_RCX;
  void *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  uchar temp [16];
  int ossl_is_little_endian;
  size_t plen;
  size_t rem;
  EVP_CHACHA_AEAD_CTX *actx;
  size_t in_stack_00000110;
  uchar *in_stack_00000118;
  uchar *in_stack_00000120;
  EVP_CIPHER_CTX *in_stack_00000128;
  uchar *in_stack_ffffffffffffff98;
  POLY1305 *in_stack_ffffffffffffffa0;
  uchar *in_stack_ffffffffffffffa8;
  POLY1305 *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar3;
  POLY1305 *ctx_00;
  uchar *in_stack_ffffffffffffffc8;
  uchar *out_00;
  void *local_20;
  undefined8 *local_18;
  
  out_00 = *(uchar **)(in_RDI + 0x78);
  ctx_00 = *(POLY1305 **)(out_00 + 200);
  if (*(int *)(out_00 + 0xbc) == 0) {
    if ((ctx_00 != (POLY1305 *)0xffffffffffffffff) && (in_RSI != (undefined8 *)0x0)) {
      iVar2 = chacha20_poly1305_tls_cipher
                        (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110);
      return iVar2;
    }
    out_00[0x20] = '\0';
    out_00[0x21] = '\0';
    out_00[0x22] = '\0';
    out_00[0x23] = '\0';
    ChaCha20_ctr32(out_00 + 0x30,"",0x40,out_00,out_00 + 0x20);
    Poly1305_Init(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    out_00[0x20] = '\x01';
    out_00[0x21] = '\0';
    out_00[0x22] = '\0';
    out_00[0x23] = '\0';
    out_00[0x70] = '\0';
    out_00[0x71] = '\0';
    out_00[0x72] = '\0';
    out_00[0x73] = '\0';
    out_00[0xb0] = '\0';
    out_00[0xb1] = '\0';
    out_00[0xb2] = '\0';
    out_00[0xb3] = '\0';
    out_00[0xb4] = '\0';
    out_00[0xb5] = '\0';
    out_00[0xb6] = '\0';
    out_00[0xb7] = '\0';
    out_00[0xa8] = '\0';
    out_00[0xa9] = '\0';
    out_00[0xaa] = '\0';
    out_00[0xab] = '\0';
    out_00[0xac] = '\0';
    out_00[0xad] = '\0';
    out_00[0xae] = '\0';
    out_00[0xaf] = '\0';
    out_00[0xbc] = '\x01';
    out_00[0xbd] = '\0';
    out_00[0xbe] = '\0';
    out_00[0xbf] = '\0';
    if (ctx_00 != (POLY1305 *)0xffffffffffffffff) {
      Poly1305_Update(ctx_00,(uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (size_t)in_stack_ffffffffffffffb0);
      out_00[0xa8] = '\r';
      out_00[0xa9] = '\0';
      out_00[0xaa] = '\0';
      out_00[0xab] = '\0';
      out_00[0xac] = '\0';
      out_00[0xad] = '\0';
      out_00[0xae] = '\0';
      out_00[0xaf] = '\0';
      out_00[0xb8] = '\x01';
      out_00[0xb9] = '\0';
      out_00[0xba] = '\0';
      out_00[0xbb] = '\0';
    }
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_RDX != (void *)0x0) {
    if (in_RSI == (undefined8 *)0x0) {
      Poly1305_Update(ctx_00,(uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (size_t)in_stack_ffffffffffffffb0);
      *(long *)(out_00 + 0xa8) = (long)in_RCX->opaque + *(long *)(out_00 + 0xa8);
      out_00[0xb8] = '\x01';
      out_00[0xb9] = '\0';
      out_00[0xba] = '\0';
      out_00[0xbb] = '\0';
      return (int)in_RCX;
    }
    if (*(int *)(out_00 + 0xb8) != 0) {
      in_stack_ffffffffffffffc8 = (uchar *)(*(ulong *)(out_00 + 0xa8) & 0xf);
      if (in_stack_ffffffffffffffc8 != (uchar *)0x0) {
        Poly1305_Update(ctx_00,(uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ),(size_t)in_stack_ffffffffffffffb0);
      }
      out_00[0xb8] = '\0';
      out_00[0xb9] = '\0';
      out_00[0xba] = '\0';
      out_00[0xbb] = '\0';
    }
    out_00[200] = 0xff;
    out_00[0xc9] = 0xff;
    out_00[0xca] = 0xff;
    out_00[0xcb] = 0xff;
    out_00[0xcc] = 0xff;
    out_00[0xcd] = 0xff;
    out_00[0xce] = 0xff;
    out_00[0xcf] = 0xff;
    pPVar1 = in_RCX;
    if ((ctx_00 != (POLY1305 *)0xffffffffffffffff) &&
       (pPVar1 = ctx_00, in_RCX != (POLY1305 *)(ctx_00->opaque + 2))) {
      return -1;
    }
    ctx_00 = pPVar1;
    if (*(int *)(in_RDI + 0x10) == 0) {
      Poly1305_Update(ctx_00,(uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (size_t)in_stack_ffffffffffffffb0);
      chacha_cipher((EVP_CIPHER_CTX *)in_RCX,out_00,in_stack_ffffffffffffffc8,(size_t)ctx_00);
      *(long *)(out_00 + 0xb0) = (long)ctx_00->opaque + *(long *)(out_00 + 0xb0);
    }
    else {
      chacha_cipher((EVP_CIPHER_CTX *)in_RCX,out_00,in_stack_ffffffffffffffc8,(size_t)ctx_00);
      Poly1305_Update(ctx_00,(uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (size_t)in_stack_ffffffffffffffb0);
      *(long *)(out_00 + 0xb0) = (long)ctx_00->opaque + *(long *)(out_00 + 0xb0);
    }
    local_18 = (undefined8 *)((long)ctx_00->opaque + (long)in_RSI);
    local_20 = (void *)((long)ctx_00->opaque + (long)in_RDX);
  }
  if ((local_20 == (void *)0x0) || (ctx_00 != in_RCX)) {
    uVar3 = 1;
    if (*(int *)(out_00 + 0xb8) != 0) {
      if ((*(ulong *)(out_00 + 0xa8) & 0xf) != 0) {
        Poly1305_Update(ctx_00,(uchar *)CONCAT44(1,in_stack_ffffffffffffffb8),
                        (size_t)in_stack_ffffffffffffffb0);
      }
      out_00[0xb8] = '\0';
      out_00[0xb9] = '\0';
      out_00[0xba] = '\0';
      out_00[0xbb] = '\0';
    }
    if ((*(ulong *)(out_00 + 0xb0) & 0xf) != 0) {
      Poly1305_Update(ctx_00,(uchar *)CONCAT44(uVar3,in_stack_ffffffffffffffb8),
                      (size_t)in_stack_ffffffffffffffb0);
    }
    Poly1305_Update(ctx_00,(uchar *)CONCAT44(uVar3,in_stack_ffffffffffffffb8),
                    (size_t)in_stack_ffffffffffffffb0);
    Poly1305_Final(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    out_00[0xbc] = '\0';
    out_00[0xbd] = '\0';
    out_00[0xbe] = '\0';
    out_00[0xbf] = '\0';
    if ((local_20 == (void *)0x0) || (in_RCX == ctx_00)) {
      if ((*(int *)(in_RDI + 0x10) == 0) &&
         (iVar2 = CRYPTO_memcmp(&stack0xffffffffffffffa8,out_00 + 0x84,(long)*(int *)(out_00 + 0xc0)
                               ), iVar2 != 0)) {
        return -1;
      }
    }
    else if (*(int *)(in_RDI + 0x10) == 0) {
      iVar2 = CRYPTO_memcmp(&stack0xffffffffffffffa8,local_20,0x10);
      if (iVar2 != 0) {
        memset((void *)((long)local_18 - (long)ctx_00),0,(size_t)ctx_00);
        return -1;
      }
    }
    else {
      *local_18 = *(undefined8 *)(out_00 + 0x84);
      local_18[1] = *(undefined8 *)(out_00 + 0x8c);
    }
  }
  return (int)in_RCX;
}

Assistant:

static int chacha20_poly1305_cipher(void *vctx, unsigned char *out,
                                    size_t *outl, size_t outsize,
                                    const unsigned char *in, size_t inl)
{
    PROV_CIPHER_CTX *ctx = (PROV_CIPHER_CTX *)vctx;
    PROV_CIPHER_HW_CHACHA20_POLY1305 *hw =
        (PROV_CIPHER_HW_CHACHA20_POLY1305 *)ctx->hw;

    if (!ossl_prov_is_running())
        return 0;

    if (inl == 0) {
        *outl = 0;
        return 1;
    }

    if (outsize < inl) {
        ERR_raise(ERR_LIB_PROV, PROV_R_OUTPUT_BUFFER_TOO_SMALL);
        return 0;
    }

    if (!hw->aead_cipher(ctx, out, outl, in, inl))
        return 0;

    return 1;
}